

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O1

void __thiscall de::cmdline::detail::TypedFieldMap::clear(TypedFieldMap *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_fields)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (*(code *)p_Var1[1]._M_left)();
    }
  }
  std::
  _Rb_tree<const_std::type_info_*,_std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>,_std::_Select1st<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
  ::clear((_Rb_tree<const_std::type_info_*,_std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>,_std::_Select1st<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
           *)this);
  return;
}

Assistant:

void TypedFieldMap::clear (void)
{
	for (Map::const_iterator iter = m_fields.begin(); iter != m_fields.end(); ++iter)
	{
		if (iter->second.value)
			iter->second.destructor(iter->second.value);
	}
	m_fields.clear();
}